

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

void swrenderer::R_MapPlane(int y,int x1)

{
  uint uVar1;
  int32_t iVar2;
  double dVar3;
  double distance;
  int x2;
  int x1_local;
  int y_local;
  
  uVar1 = (uint)spanend[y];
  if (((((int)uVar1 < x1) || (x1 < 0)) || (viewwidth <= (int)uVar1)) ||
     ((uint)viewheight <= (uint)y)) {
    I_FatalError("R_MapPlane: %i, %i at %i",(ulong)(uint)x1,(ulong)uVar1,(ulong)(uint)y);
  }
  dVar3 = planeheight * (double)*(float *)(yslope + (long)y * 4);
  if (_ds_xbits == 0) {
    drawerargs::ds_xstep = 0;
    drawerargs::ds_xfrac = 0;
  }
  else {
    drawerargs::ds_xstep = xs_ToFixed(0x20 - _ds_xbits,(real64)(dVar3 * xstepscale));
    iVar2 = xs_ToFixed(0x20 - _ds_xbits,(real64)(dVar3 * basexfrac));
    drawerargs::ds_xfrac = iVar2 + pviewx;
  }
  if (_ds_ybits == 0) {
    drawerargs::ds_ystep = 0;
    drawerargs::ds_yfrac = 0;
  }
  else {
    drawerargs::ds_ystep = xs_ToFixed(0x20 - _ds_ybits,(real64)(dVar3 * ystepscale));
    iVar2 = xs_ToFixed(0x20 - _ds_ybits,(real64)(dVar3 * baseyfrac));
    drawerargs::ds_yfrac = iVar2 + pviewy;
  }
  if ((plane_shade & 1U) != 0) {
    R_SetDSColorMapLight(basecolormap,(float)(GlobVis * ABS(CenterY - (double)y)),planeshade);
  }
  drawerargs::ds_y = y;
  drawerargs::ds_x1 = x1;
  drawerargs::ds_x2 = uVar1;
  (*spanfunc)();
  return;
}

Assistant:

void R_MapPlane (int y, int x1)
{
	int x2 = spanend[y];
	double distance;

#ifdef RANGECHECK
	if (x2 < x1 || x1<0 || x2>=viewwidth || (unsigned)y>=(unsigned)viewheight)
	{
		I_FatalError ("R_MapPlane: %i, %i at %i", x1, x2, y);
	}
#endif

	// [RH] Notice that I dumped the caching scheme used by Doom.
	// It did not offer any appreciable speedup.

	distance = planeheight * yslope[y];

	if (ds_xbits != 0)
	{
		ds_xstep = xs_ToFixed(32 - ds_xbits, distance * xstepscale);
		ds_xfrac = xs_ToFixed(32 - ds_xbits, distance * basexfrac) + pviewx;
	}
	else
	{
		ds_xstep = 0;
		ds_xfrac = 0;
	}
	if (ds_ybits != 0)
	{
		ds_ystep = xs_ToFixed(32 - ds_ybits, distance * ystepscale);
		ds_yfrac = xs_ToFixed(32 - ds_ybits, distance * baseyfrac) + pviewy;
	}
	else
	{
		ds_ystep = 0;
		ds_yfrac = 0;
	}

	if (plane_shade)
	{
		// Determine lighting based on the span's distance from the viewer.
		R_SetDSColorMapLight(basecolormap, GlobVis * fabs(CenterY - y), planeshade);
	}

	ds_y = y;
	ds_x1 = x1;
	ds_x2 = x2;

	spanfunc ();
}